

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O1

int Tas_ManResolve(Tas_Man_t *p,int Level,int hClause0,int hClause1)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t **ppGVar5;
  int iVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  long lVar9;
  
  ppGVar5 = (p->pClauses).pData;
  pGVar8 = ppGVar5[Level];
  if (pGVar8 == (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[hClause0] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                  ,0x36e,"int Tas_ManResolve(Tas_Man_t *, int, int, int)");
  }
  if (pGVar8 != ppGVar5[hClause0]) {
    __assert_fail("pQue->pData[hClause0] == pQue->pData[hClause1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                  ,0x36f,"int Tas_ManResolve(Tas_Man_t *, int, int, int)");
  }
  iVar7 = (p->pClauses).iTail;
  if ((p->pClauses).iHead != iVar7) {
    __assert_fail("Tas_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                  ,0x376,"int Tas_ManResolve(Tas_Man_t *, int, int, int)");
  }
  iVar1 = (p->pClauses).nSize;
  if (iVar7 == iVar1) {
    (p->pClauses).nSize = iVar1 * 2;
    ppGVar5 = (p->pClauses).pData;
    if (ppGVar5 == (Gia_Obj_t **)0x0) {
      ppGVar5 = (Gia_Obj_t **)malloc((long)iVar1 << 4);
    }
    else {
      ppGVar5 = (Gia_Obj_t **)realloc(ppGVar5,(long)iVar1 << 4);
    }
    (p->pClauses).pData = ppGVar5;
  }
  iVar7 = (p->pClauses).iTail;
  (p->pClauses).iTail = iVar7 + 1;
  (p->pClauses).pData[iVar7] = (Gia_Obj_t *)0x0;
  pGVar8 = (p->pClauses).pData[(long)Level + 1];
  if (pGVar8 == (Gia_Obj_t *)0x0) {
    iVar7 = -1;
  }
  else {
    lVar9 = (long)(Level + 1) * 8;
    iVar7 = -1;
    do {
      lVar9 = lVar9 + 8;
      if (-1 < (long)*(ulong *)pGVar8) {
        *(ulong *)pGVar8 = *(ulong *)pGVar8 | 0x8000000000000000;
        iVar1 = (p->pClauses).nSize;
        if ((p->pClauses).iTail == iVar1) {
          (p->pClauses).nSize = iVar1 * 2;
          ppGVar5 = (p->pClauses).pData;
          if (ppGVar5 == (Gia_Obj_t **)0x0) {
            ppGVar5 = (Gia_Obj_t **)malloc((long)iVar1 << 4);
          }
          else {
            ppGVar5 = (Gia_Obj_t **)realloc(ppGVar5,(long)iVar1 << 4);
          }
          (p->pClauses).pData = ppGVar5;
        }
        iVar1 = (p->pClauses).iTail;
        (p->pClauses).iTail = iVar1 + 1;
        (p->pClauses).pData[iVar1] = pGVar8;
        uVar2 = pGVar8->Value;
        if (uVar2 == 0xffffffff) goto LAB_006ebe7d;
        uVar4 = uVar2 * 3;
        if ((int)uVar4 < 0) goto LAB_006ebe5e;
        uVar3 = p->vLevReas->nSize;
        if (uVar3 == uVar4 || SBORROW4(uVar3,uVar4) != (int)(uVar3 + uVar2 * -3) < 0)
        goto LAB_006ebe5e;
        iVar1 = p->vLevReas->pArray[uVar4];
        if (iVar7 <= iVar1) {
          iVar7 = iVar1;
        }
      }
      pGVar8 = *(Gia_Obj_t **)((long)(p->pClauses).pData + lVar9);
    } while (pGVar8 != (Gia_Obj_t *)0x0);
  }
  pGVar8 = (p->pClauses).pData[(long)hClause0 + 1];
  if (pGVar8 != (Gia_Obj_t *)0x0) {
    lVar9 = (long)(hClause0 + 1) * 8;
    do {
      lVar9 = lVar9 + 8;
      if (-1 < (long)*(ulong *)pGVar8) {
        *(ulong *)pGVar8 = *(ulong *)pGVar8 | 0x8000000000000000;
        iVar1 = (p->pClauses).nSize;
        if ((p->pClauses).iTail == iVar1) {
          (p->pClauses).nSize = iVar1 * 2;
          ppGVar5 = (p->pClauses).pData;
          if (ppGVar5 == (Gia_Obj_t **)0x0) {
            ppGVar5 = (Gia_Obj_t **)malloc((long)iVar1 << 4);
          }
          else {
            ppGVar5 = (Gia_Obj_t **)realloc(ppGVar5,(long)iVar1 << 4);
          }
          (p->pClauses).pData = ppGVar5;
        }
        iVar1 = (p->pClauses).iTail;
        (p->pClauses).iTail = iVar1 + 1;
        (p->pClauses).pData[iVar1] = pGVar8;
        uVar2 = pGVar8->Value;
        if (uVar2 == 0xffffffff) {
LAB_006ebe7d:
          __assert_fail("pVar->Value != ~0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                        ,0x83,"int Tas_VarDecLevel(Tas_Man_t *, Gia_Obj_t *)");
        }
        uVar4 = uVar2 * 3;
        if ((int)uVar4 < 0) {
LAB_006ebe5e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar3 = p->vLevReas->nSize;
        if (uVar3 == uVar4 || SBORROW4(uVar3,uVar4) != (int)(uVar3 + uVar2 * -3) < 0)
        goto LAB_006ebe5e;
        iVar1 = p->vLevReas->pArray[uVar4];
        if (iVar7 <= iVar1) {
          iVar7 = iVar1;
        }
      }
      pGVar8 = *(Gia_Obj_t **)((long)(p->pClauses).pData + lVar9);
    } while (pGVar8 != (Gia_Obj_t *)0x0);
  }
  iVar1 = (p->pClauses).iHead;
  if (iVar1 + 1 < (p->pClauses).iTail) {
    lVar9 = (long)iVar1 + 1;
    do {
      pGVar8 = (p->pClauses).pData[lVar9];
      *(ulong *)pGVar8 = *(ulong *)pGVar8 & 0x7fffffffffffffff;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->pClauses).iTail);
  }
  Tas_ManDeriveReason(p,iVar7);
  iVar7 = (p->pClauses).iHead;
  iVar1 = (p->pClauses).iTail;
  if (iVar1 <= iVar7) {
    __assert_fail("p->iHead < p->iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                  ,0x1a5,"int Tas_QueFinish(Tas_Que_t *)");
  }
  iVar6 = (p->pClauses).nSize;
  if (iVar1 == iVar6) {
    (p->pClauses).nSize = iVar6 * 2;
    ppGVar5 = (p->pClauses).pData;
    if (ppGVar5 == (Gia_Obj_t **)0x0) {
      ppGVar5 = (Gia_Obj_t **)malloc((long)iVar6 << 4);
    }
    else {
      ppGVar5 = (Gia_Obj_t **)realloc(ppGVar5,(long)iVar6 << 4);
    }
    (p->pClauses).pData = ppGVar5;
  }
  iVar1 = (p->pClauses).iTail;
  iVar6 = iVar1 + 1;
  (p->pClauses).iTail = iVar6;
  (p->pClauses).pData[iVar1] = (Gia_Obj_t *)0x0;
  (p->pClauses).iHead = iVar6;
  return iVar7;
}

Assistant:

static inline int Tas_ManResolve( Tas_Man_t * p, int Level, int hClause0, int hClause1 )
{
    Tas_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pObj;
    int i, LevelMax = -1, LevelCur;
    assert( pQue->pData[hClause0] != NULL );
    assert( pQue->pData[hClause0] == pQue->pData[hClause1] );
/*
    for ( i = hClause0 + 1; (pObj = pQue->pData[i]); i++ )
        assert( pObj->fPhase == 0 );
    for ( i = hClause1 + 1; (pObj = pQue->pData[i]); i++ )
        assert( pObj->fPhase == 0 );
*/
    assert( Tas_QueIsEmpty( pQue ) );
    Tas_QuePush( pQue, NULL );
    for ( i = hClause0 + 1; (pObj = pQue->pData[i]); i++ )
    {
        if ( pObj->fPhase ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fPhase = 1;
        Tas_QuePush( pQue, pObj );
        LevelCur = Tas_VarDecLevel( p, pObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
    for ( i = hClause1 + 1; (pObj = pQue->pData[i]); i++ )
    {
        if ( pObj->fPhase ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fPhase = 1;
        Tas_QuePush( pQue, pObj );
        LevelCur = Tas_VarDecLevel( p, pObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
    for ( i = pQue->iHead + 1; i < pQue->iTail; i++ )
        pQue->pData[i]->fPhase = 0;
    Tas_ManDeriveReason( p, LevelMax );
    return Tas_QueFinish( pQue );
}